

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O3

bool __thiscall
cmConditionEvaluator::HandleLevel4
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  string *psVar1;
  MessageType *pMVar2;
  bool bVar3;
  _Self __tmp_1;
  iterator iVar4;
  _Self __tmp;
  _List_node_base *p_Var5;
  cmConditionEvaluator *pcVar6;
  iterator iVar7;
  bool bVar8;
  iterator argP2;
  int reducible;
  iterator arg;
  iterator local_80;
  int local_74;
  iterator local_70;
  string local_68;
  iterator local_48;
  string *local_40;
  MessageType *local_38;
  
  local_40 = errorString;
  local_38 = status;
  do {
    local_74 = 0;
    p_Var5 = (newArgs->
             super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    local_80._M_node = (_List_node_base *)0x0;
    if (p_Var5 == (_List_node_base *)newArgs) {
      return true;
    }
    do {
      local_48._M_node = p_Var5;
      if ((p_Var5 != (_List_node_base *)newArgs) &&
         (local_48._M_node = p_Var5->_M_next, local_80._M_node = local_48._M_node,
         local_48._M_node != (_List_node_base *)newArgs)) {
        local_80._M_node = (local_48._M_node)->_M_next;
      }
      iVar4._M_node = local_48._M_node;
      local_70._M_node = p_Var5;
      if (local_48._M_node != (_List_node_base *)newArgs) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"AND","");
        bVar3 = IsKeyword(this,&local_68,(cmExpandedCommandArgument *)(iVar4._M_node + 1));
        bVar8 = local_80._M_node != (_List_node_base *)newArgs;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        pMVar2 = local_38;
        psVar1 = local_40;
        if (bVar3 && bVar8) {
          bVar3 = GetBooleanValueWithAutoDereference
                            (this,(cmExpandedCommandArgument *)(p_Var5 + 1),local_40,local_38,false)
          ;
          pcVar6 = this;
          bVar8 = GetBooleanValueWithAutoDereference
                            (this,(cmExpandedCommandArgument *)(local_80._M_node + 1),psVar1,pMVar2,
                             false);
          HandleBinaryOp(pcVar6,bVar8 && bVar3,&local_74,&local_70,newArgs,&local_48,&local_80);
          iVar4._M_node = local_48._M_node;
        }
      }
      iVar7._M_node = local_70._M_node;
      if (iVar4._M_node != (_List_node_base *)newArgs) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"OR","");
        bVar3 = IsKeyword(this,&local_68,(cmExpandedCommandArgument *)(iVar4._M_node + 1));
        iVar4._M_node = local_80._M_node;
        bVar8 = local_80._M_node != (_List_node_base *)newArgs;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        pMVar2 = local_38;
        psVar1 = local_40;
        iVar7._M_node = local_70._M_node;
        if (bVar3 && bVar8) {
          bVar3 = GetBooleanValueWithAutoDereference
                            (this,(cmExpandedCommandArgument *)(local_70._M_node + 1),local_40,
                             local_38,false);
          pcVar6 = this;
          bVar8 = GetBooleanValueWithAutoDereference
                            (this,(cmExpandedCommandArgument *)(iVar4._M_node + 1),psVar1,pMVar2,
                             false);
          HandleBinaryOp(pcVar6,bVar8 || bVar3,&local_74,&local_70,newArgs,&local_48,&local_80);
        }
      }
      p_Var5 = (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                  *)&(iVar7._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var5 != (_List_node_base *)newArgs);
  } while (local_74 != 0);
  return true;
}

Assistant:

bool cmConditionEvaluator::HandleLevel4(cmArgumentList &newArgs,
                  std::string &errorString,
                  cmake::MessageType &status)
{
  int reducible;
  bool lhs;
  bool rhs;
  do
    {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    cmArgumentList::iterator argP1;
    cmArgumentList::iterator argP2;
    while (arg != newArgs.end())
      {
      argP1 = arg;
      IncrementArguments(newArgs,argP1,argP2);
      if (argP1 != newArgs.end() && IsKeyword("AND", *argP1) &&
        argP2 != newArgs.end())
        {
        lhs = this->GetBooleanValueWithAutoDereference(*arg,
                                                 errorString,
                                                 status);
        rhs = this->GetBooleanValueWithAutoDereference(*argP2,
                                                 errorString,
                                                 status);
        this->HandleBinaryOp((lhs && rhs),
          reducible, arg, newArgs, argP1, argP2);
        }

      if (argP1 != newArgs.end() && this->IsKeyword("OR", *argP1) &&
        argP2 != newArgs.end())
        {
        lhs = this->GetBooleanValueWithAutoDereference(*arg,
                                                 errorString,
                                                 status);
        rhs = this->GetBooleanValueWithAutoDereference(*argP2,
                                                 errorString,
                                                 status);
        this->HandleBinaryOp((lhs || rhs),
          reducible, arg, newArgs, argP1, argP2);
        }
      ++arg;
      }
    }
  while (reducible);
  return true;
}